

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_csv.cpp
# Opt level: O1

void __thiscall Csv_EmptyContainer_Test::TestBody(Csv_EmptyContainer_Test *this)

{
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RCX;
  char *message;
  AssertionResult gtest_ar;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  l;
  AssertHelper local_50;
  PredicateFormatterFromMatcher<testing::IsEmptyMatcher> local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_20;
  
  local_20._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_20;
  local_20._M_impl._M_node._M_size = 0;
  local_20._M_impl._M_node.super__List_node_base._M_prev =
       local_20._M_impl._M_node.super__List_node_base._M_next;
  pstore::command_line::csv<std::_List_iterator<std::__cxx11::string>>
            ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_38,(command_line *)local_20._M_impl._M_node.super__List_node_base._M_next,
             (_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_20._M_impl._M_node.super__List_node_base._M_next,in_RCX);
  testing::internal::PredicateFormatterFromMatcher<testing::IsEmptyMatcher>::operator()
            (local_48,(char *)&local_50,
             (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)"csv (std::begin (l), std::end (l))");
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_38);
  if (local_48[0] == (PredicateFormatterFromMatcher<testing::IsEmptyMatcher>)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_csv.cpp"
               ,0x2b,message);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_38._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
      (*(code *)(local_38._M_impl._M_node.super__List_node_base._M_next)->_M_next->_M_prev)();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_20);
  return;
}

Assistant:

TEST (Csv, EmptyContainer) {
    std::list<std::string> l;
    EXPECT_THAT (csv (std::begin (l), std::end (l)), ::testing::IsEmpty ());
}